

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_update_hashes(SAM_hdr *sh,int type,SAM_hdr_type *h_type)

{
  char cVar1;
  char *pcVar2;
  kh_cstr_t pcVar3;
  uint32_t uVar4;
  khint_t kVar5;
  SAM_SQ *pSVar6;
  char *pcVar7;
  SAM_RG *pSVar8;
  size_t sVar9;
  SAM_PG *pSVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  uint uVar14;
  SAM_hdr_tag *pSVar15;
  int iVar16;
  int i;
  long lVar17;
  long lVar18;
  int iVar19;
  int r_2;
  int r_1;
  int r;
  
  iVar16 = type >> 8;
  if ((type & 0xffU) == 0x51 && iVar16 == 0x53) {
    iVar13 = sh->nref;
    lVar17 = (long)iVar13;
    pSVar6 = (SAM_SQ *)realloc(sh->ref,lVar17 * 0x20 + 0x20);
    sh->ref = pSVar6;
    if (pSVar6 != (SAM_SQ *)0x0) {
      pSVar15 = h_type->tag;
      pSVar6[lVar17].name = (char *)0x0;
      pSVar6[lVar17].len = 0;
      pSVar6[lVar17].ty = h_type;
      pSVar6[lVar17].tag = pSVar15;
      for (; pSVar15 != (SAM_hdr_tag *)0x0; pSVar15 = pSVar15->next) {
        pcVar2 = pSVar15->str;
        if (*pcVar2 == 'L') {
          if (pcVar2[1] == 'N') {
            uVar4 = atoi(pcVar2 + 3);
            sh->ref[lVar17].len = uVar4;
          }
        }
        else if ((*pcVar2 == 'S') && (pcVar2[1] == 'N')) {
          iVar19 = pSVar15->len;
          pcVar7 = (char *)malloc((long)iVar19);
          pSVar6 = sh->ref;
          pSVar6[lVar17].name = pcVar7;
          if (pcVar7 == (char *)0x0) {
            return -1;
          }
          strncpy(pcVar7,pcVar2 + 3,(long)iVar19 - 3);
          pSVar6[lVar17].name[(long)pSVar15->len + -3] = '\0';
        }
      }
      pcVar3 = sh->ref[lVar17].name;
      if (pcVar3 != (kh_cstr_t)0x0) {
        kVar5 = kh_put_m_s2i(sh->ref_hash,pcVar3,&r);
        if (r == -1) goto LAB_0012f822;
        sh->ref_hash->vals[kVar5] = iVar13;
      }
      sh->nref = sh->nref + 1;
      goto LAB_0012f552;
    }
LAB_0012f822:
    iVar13 = -1;
  }
  else {
LAB_0012f552:
    uVar14 = type & 0xffU ^ 0x47;
    if (iVar16 == 0x52 && uVar14 == 0) {
      iVar13 = sh->nrg;
      lVar17 = (long)iVar13;
      pSVar8 = (SAM_RG *)realloc(sh->rg,lVar17 * 0x20 + 0x20);
      sh->rg = pSVar8;
      if (pSVar8 == (SAM_RG *)0x0) {
        return -1;
      }
      pSVar15 = h_type->tag;
      pSVar8[lVar17].name = (char *)0x0;
      pSVar8[lVar17].name_len = 0;
      pSVar8[lVar17].ty = h_type;
      pSVar8[lVar17].tag = pSVar15;
      pSVar8[lVar17].id = iVar13;
      for (; pSVar15 != (SAM_hdr_tag *)0x0; pSVar15 = pSVar15->next) {
        pcVar2 = pSVar15->str;
        if ((*pcVar2 == 'I') && (pcVar2[1] == 'D')) {
          iVar19 = pSVar15->len;
          pcVar7 = (char *)malloc((long)iVar19);
          pSVar8[lVar17].name = pcVar7;
          if (pcVar7 == (char *)0x0) {
            return -1;
          }
          strncpy(pcVar7,pcVar2 + 3,(long)iVar19 - 3);
          pSVar8[lVar17].name[(long)pSVar15->len + -3] = '\0';
          pSVar8 = sh->rg;
          sVar9 = strlen(pSVar8[lVar17].name);
          pSVar8[lVar17].name_len = (int)sVar9;
        }
      }
      if (pSVar8[lVar17].name != (kh_cstr_t)0x0) {
        kVar5 = kh_put_m_s2i(sh->rg_hash,pSVar8[lVar17].name,&r_1);
        if (r_1 == -1) goto LAB_0012f822;
        sh->rg_hash->vals[kVar5] = iVar13;
      }
      sh->nrg = sh->nrg + 1;
    }
    iVar13 = 0;
    if (iVar16 == 0x50 && uVar14 == 0) {
      iVar16 = sh->npg;
      lVar17 = (long)iVar16;
      pSVar10 = (SAM_PG *)realloc(sh->pg,lVar17 * 0x28 + 0x28);
      sh->pg = pSVar10;
      iVar13 = -1;
      if (pSVar10 != (SAM_PG *)0x0) {
        pSVar15 = h_type->tag;
        pSVar10[lVar17].name = (char *)0x0;
        pSVar10[lVar17].name_len = 0;
        pSVar10[lVar17].ty = h_type;
        pSVar10[lVar17].tag = pSVar15;
        pSVar10[lVar17].id = iVar16;
        pSVar10[lVar17].prev_id = -1;
        for (; pSVar15 != (SAM_hdr_tag *)0x0; pSVar15 = pSVar15->next) {
          pcVar2 = pSVar15->str;
          if (*pcVar2 == 'P') {
            if (pcVar2[1] == 'P') {
              cVar1 = pcVar2[pSVar15->len];
              pcVar2[pSVar15->len] = '\0';
              pcVar2 = pSVar15->str;
              kVar5 = kh_get_m_s2i(sh->pg_hash,pcVar2 + 3);
              pcVar2[pSVar15->len] = cVar1;
              if (kVar5 == sh->pg_hash->n_buckets) {
                sh->pg[lVar17].prev_id = -1;
              }
              else {
                iVar13 = sh->pg_hash->vals[kVar5];
                sh->pg[lVar17].prev_id = sh->pg[iVar13].id;
                uVar11 = (ulong)sh->npg_end;
                if (((long)uVar11 < 1) || (sh->pg_end[uVar11 - 1] != iVar13)) {
                  iVar19 = -1;
                  for (lVar18 = 0; lVar18 < (int)uVar11; lVar18 = lVar18 + 1) {
                    piVar12 = sh->pg_end;
                    if (piVar12[lVar18] == iVar13) {
                      memmove(piVar12 + lVar18,piVar12 + lVar18 + 1,
                              (long)((int)uVar11 + iVar19) << 2);
                      uVar14 = sh->npg_end - 1;
                      uVar11 = (ulong)uVar14;
                      sh->npg_end = uVar14;
                    }
                    iVar19 = iVar19 + -1;
                  }
                }
                else {
                  sh->npg_end = sh->npg_end + -1;
                }
              }
            }
          }
          else if ((*pcVar2 == 'I') && (pcVar2[1] == 'D')) {
            iVar13 = pSVar15->len;
            pcVar7 = (char *)malloc((long)iVar13);
            pSVar10 = sh->pg;
            pSVar10[lVar17].name = pcVar7;
            if (pcVar7 == (char *)0x0) {
              return -1;
            }
            strncpy(pcVar7,pcVar2 + 3,(long)iVar13 - 3);
            pSVar10[lVar17].name[(long)pSVar15->len + -3] = '\0';
            pSVar10 = sh->pg;
            sVar9 = strlen(pSVar10[lVar17].name);
            pSVar10[lVar17].name_len = (int)sVar9;
          }
        }
        pcVar3 = sh->pg[lVar17].name;
        if (pcVar3 != (kh_cstr_t)0x0) {
          kVar5 = kh_put_m_s2i(sh->pg_hash,pcVar3,&r_2);
          if (r_2 == -1) {
            return -1;
          }
          sh->pg_hash->vals[kVar5] = iVar16;
        }
        iVar13 = sh->npg_end;
        iVar19 = sh->npg_end_alloc;
        piVar12 = sh->pg_end;
        if (iVar19 <= iVar13) {
          iVar13 = 4;
          if (iVar19 != 0) {
            iVar13 = iVar19 * 2;
          }
          sh->npg_end_alloc = iVar13;
          piVar12 = (int *)realloc(piVar12,(long)iVar13 << 2);
          sh->pg_end = piVar12;
          if (piVar12 == (int *)0x0) {
            return -1;
          }
          iVar13 = sh->npg_end;
        }
        sh->npg_end = iVar13 + 1;
        piVar12[iVar13] = iVar16;
        sh->npg = sh->npg + 1;
        iVar13 = 0;
      }
    }
  }
  return iVar13;
}

Assistant:

static int sam_hdr_update_hashes(SAM_hdr *sh,
				 int type,
				 SAM_hdr_type *h_type) {
    /* Add to reference hash? */
    if ((type>>8) == 'S' && (type&0xff) == 'Q') {
	SAM_hdr_tag *tag;
	int nref = sh->nref;

	sh->ref = realloc(sh->ref, (sh->nref+1)*sizeof(*sh->ref));
	if (!sh->ref)
	    return -1;

	tag = h_type->tag;
	sh->ref[nref].name = NULL;
	sh->ref[nref].len  = 0;
	sh->ref[nref].ty = h_type;
	sh->ref[nref].tag  = tag;

	while (tag) {
	    if (tag->str[0] == 'S' && tag->str[1] == 'N') {
		if (!(sh->ref[nref].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->ref[nref].name, tag->str+3, tag->len-3);
		sh->ref[nref].name[tag->len-3] = 0;
	    } else if (tag->str[0] == 'L' && tag->str[1] == 'N') {
		sh->ref[nref].len = atoi(tag->str+3);
	    }
	    tag = tag->next;
	}

	if (sh->ref[nref].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->ref_hash, sh->ref[nref].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->ref_hash, k) = nref;
	}

	sh->nref++;
    }

    /* Add to read-group hash? */
    if ((type>>8) == 'R' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int nrg = sh->nrg;

	sh->rg = realloc(sh->rg, (sh->nrg+1)*sizeof(*sh->rg));
	if (!sh->rg)
	    return -1;

	tag = h_type->tag;
	sh->rg[nrg].name = NULL;
	sh->rg[nrg].name_len = 0;
	sh->rg[nrg].ty   = h_type;
	sh->rg[nrg].tag  = tag;
	sh->rg[nrg].id   = nrg;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->rg[nrg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->rg[nrg].name, tag->str+3, tag->len-3);
		sh->rg[nrg].name[tag->len-3] = 0;
		sh->rg[nrg].name_len = strlen(sh->rg[nrg].name);
	    }
	    tag = tag->next;
	}

	if (sh->rg[nrg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->rg_hash, sh->rg[nrg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->rg_hash, k) = nrg;
	}

	sh->nrg++;
    }

    /* Add to program hash? */
    if ((type>>8) == 'P' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int npg = sh->npg;

	sh->pg = realloc(sh->pg, (sh->npg+1)*sizeof(*sh->pg));
	if (!sh->pg)
	    return -1;

	tag = h_type->tag;
	sh->pg[npg].name = NULL;
	sh->pg[npg].name_len = 0;
	sh->pg[npg].ty  = h_type;
	sh->pg[npg].tag  = tag;
	sh->pg[npg].id   = npg;
	sh->pg[npg].prev_id = -1;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->pg[npg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->pg[npg].name, tag->str+3, tag->len-3);
		sh->pg[npg].name[tag->len-3] = 0;
		sh->pg[npg].name_len = strlen(sh->pg[npg].name);
	    } else if (tag->str[0] == 'P' && tag->str[1] == 'P') {
		// Resolve later if needed
		khint_t k;
		char tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
		k = kh_get(m_s2i, sh->pg_hash, tag->str+3);
		tag->str[tag->len] = tmp;

		if (k != kh_end(sh->pg_hash)) {
		    int p_id = kh_val(sh->pg_hash, k);
		    sh->pg[npg].prev_id = sh->pg[p_id].id;

		    /* Unmark previous entry as a PG termination */
		    if (sh->npg_end > 0 &&
			sh->pg_end[sh->npg_end-1] == p_id) {
			sh->npg_end--;
		    } else {
			int i;
			for (i = 0; i < sh->npg_end; i++) {
			    if (sh->pg_end[i] == p_id) {
				memmove(&sh->pg_end[i], &sh->pg_end[i+1],
					(sh->npg_end-i-1)*sizeof(*sh->pg_end));
				sh->npg_end--;
			    }
			}
		    }
		} else {
		    sh->pg[npg].prev_id = -1;
		}
	    }
	    tag = tag->next;
	}

	if (sh->pg[npg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->pg_hash, sh->pg[npg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->pg_hash, k) = npg;
	}

	/* Add to npg_end[] array. Remove later if we find a PP line */
	if (sh->npg_end >= sh->npg_end_alloc) {
	    sh->npg_end_alloc = sh->npg_end_alloc
		? sh->npg_end_alloc*2
		: 4;
	    sh->pg_end = realloc(sh->pg_end,
				 sh->npg_end_alloc * sizeof(int));
	    if (!sh->pg_end)
		return -1;
	}
	sh->pg_end[sh->npg_end++] = npg;

	sh->npg++;
    }

    return 0;
}